

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_dense.cpp
# Opt level: O2

bool runCase(int testCase)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  uint b;
  int i;
  int j;
  int iVar3;
  uint a;
  int iVar4;
  DenseGraph g_1;
  DenseGraph g;
  DenseGraph g2_1;
  
  if (9 < testCase - 1U) {
    return true;
  }
  p_Var1 = &g.s._M_t._M_impl.super__Rb_tree_header;
  switch(testCase) {
  case 1:
    DenseGraph::DenseGraph(&g);
    DenseGraph::AddEdge(&g,0,1);
    bVar2 = DenseGraph::DoesEdgeExist(&g,0,1);
    if (!bVar2) goto LAB_00101ef0;
    bVar2 = DenseGraph::DoesEdgeExist(&g,1,0);
    goto LAB_001012ef;
  case 2:
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    g.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    g.n = 4;
    g.t = false;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    DenseGraph::AddEdge(&g,0,1);
    DenseGraph::AddEdge(&g,0,2);
    DenseGraph::AddEdge(&g,1,2);
    DenseGraph::AddEdge(&g,1,3);
    bVar2 = DenseGraph::DoesEdgeExist(&g,0,1);
    if ((((bVar2) && (bVar2 = DenseGraph::DoesEdgeExist(&g,0,2), bVar2)) &&
        (bVar2 = DenseGraph::DoesEdgeExist(&g,1,2), bVar2)) &&
       ((bVar2 = DenseGraph::DoesEdgeExist(&g,1,3), bVar2 &&
        (bVar2 = DenseGraph::DoesEdgeExist(&g,0,3), !bVar2)))) {
      bVar2 = DenseGraph::DoesEdgeExist(&g,1,0);
      goto LAB_001012ef;
    }
    goto LAB_00101ef0;
  case 3:
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    g.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    g.n = 4;
    g.t = false;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    DenseGraph::DenseGraph(&g_1,&g);
    DenseGraph::AddEdge(&g_1,0,1);
    DenseGraph::AddEdge(&g_1,0,2);
    DenseGraph::AddEdge(&g_1,1,2);
    DenseGraph::AddEdge(&g_1,1,3);
    bVar2 = DenseGraph::DoesEdgeExist(&g_1,0,1);
    if (((bVar2) && (bVar2 = DenseGraph::DoesEdgeExist(&g_1,0,2), bVar2)) &&
       ((bVar2 = DenseGraph::DoesEdgeExist(&g_1,1,2), bVar2 &&
        ((bVar2 = DenseGraph::DoesEdgeExist(&g_1,1,3), bVar2 &&
         (bVar2 = DenseGraph::DoesEdgeExist(&g_1,0,3), !bVar2)))))) {
      bVar2 = DenseGraph::DoesEdgeExist(&g_1,1,0);
LAB_0010161b:
      std::
      _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
      ::~_Rb_tree(&g_1.s._M_t);
LAB_001012ef:
      std::
      _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
      ::~_Rb_tree(&g.s._M_t);
      if (bVar2 != false) {
        return false;
      }
      return true;
    }
    break;
  case 4:
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    g.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    g.n = 4;
    g.t = false;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    DenseGraph::DenseGraph(&g_1,&g);
    DenseGraph::AddEdge(&g_1,0,1);
    DenseGraph::AddEdge(&g_1,0,2);
    DenseGraph::AddEdge(&g_1,1,2);
    DenseGraph::AddEdge(&g_1,1,3);
    DenseGraph::AddEdge(&g_1,2,3);
    DenseGraph::AddEdge(&g_1,1,0);
    DenseGraph::RemoveEdge(&g_1,1,0);
    DenseGraph::AddEdge(&g_1,0,3);
    DenseGraph::RemoveEdge(&g_1,0,3);
    DenseGraph::AddEdge(&g_1,3,2);
    DenseGraph::RemoveEdge(&g_1,3,2);
    DenseGraph::AddEdge(&g_1,3,3);
    bVar2 = DenseGraph::DoesEdgeExist(&g_1,0,1);
    if (((bVar2) && (bVar2 = DenseGraph::DoesEdgeExist(&g_1,0,2), bVar2)) &&
       ((bVar2 = DenseGraph::DoesEdgeExist(&g_1,1,2), bVar2 &&
        ((((bVar2 = DenseGraph::DoesEdgeExist(&g_1,1,3), bVar2 &&
           (bVar2 = DenseGraph::DoesEdgeExist(&g_1,2,3), bVar2)) &&
          (bVar2 = DenseGraph::DoesEdgeExist(&g_1,3,3), bVar2)) &&
         ((bVar2 = DenseGraph::DoesEdgeExist(&g_1,0,3), !bVar2 &&
          (bVar2 = DenseGraph::DoesEdgeExist(&g_1,1,0), !bVar2)))))))) {
      bVar2 = DenseGraph::DoesEdgeExist(&g_1,3,2);
      goto LAB_0010161b;
    }
    break;
  case 5:
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    g.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    g.n = 5;
    g_1.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &g_1.s._M_t._M_impl.super__Rb_tree_header._M_header;
    g_1.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    g_1.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    g_1.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    g.t = false;
    g_1.n = 2;
    g_1.t = false;
    g_1.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         g_1.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    DenseGraph::operator=(&g_1,&g);
    DenseGraph::RemoveEdge(&g_1,1,2);
    DenseGraph::RemoveEdge(&g_1,0,1);
    DenseGraph::AddEdge(&g_1,0,1);
    DenseGraph::AddEdge(&g_1,0,2);
    DenseGraph::AddEdge(&g_1,1,2);
    DenseGraph::RemoveEdge(&g_1,1,3);
    DenseGraph::AddEdge(&g_1,1,3);
    DenseGraph::RemoveEdge(&g_1,4,2);
    DenseGraph::AddEdge(&g_1,4,2);
    DenseGraph::RemoveEdge(&g_1,1,0);
    DenseGraph::AddEdge(&g_1,0,3);
    DenseGraph::RemoveEdge(&g_1,0,3);
    DenseGraph::AddEdge(&g_1,3,2);
    DenseGraph::RemoveEdge(&g_1,3,2);
    bVar2 = DenseGraph::DoesEdgeExist(&g_1,0,1);
    if ((((bVar2) && (bVar2 = DenseGraph::DoesEdgeExist(&g_1,0,2), bVar2)) &&
        (bVar2 = DenseGraph::DoesEdgeExist(&g_1,1,2), bVar2)) &&
       (((bVar2 = DenseGraph::DoesEdgeExist(&g_1,1,3), bVar2 &&
         (bVar2 = DenseGraph::DoesEdgeExist(&g_1,4,2), bVar2)) &&
        ((bVar2 = DenseGraph::DoesEdgeExist(&g_1,0,3), !bVar2 &&
         (bVar2 = DenseGraph::DoesEdgeExist(&g_1,1,0), !bVar2)))))) {
      bVar2 = DenseGraph::DoesEdgeExist(&g_1,2,4);
      goto LAB_0010161b;
    }
    break;
  case 6:
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    g.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    g.n = 0x14;
    g.t = false;
    iVar3 = 0;
    iVar4 = 0;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    for (; iVar4 != 100; iVar4 = iVar4 + 1) {
      DenseGraph::AddEdge(&g,(iVar4 + 0x7d83U ^ 0x1312a) % 0x14,
                          (iVar3 * iVar4 + 0x3baa5aU ^ iVar4 + 0x20423U) % 0x14);
      iVar3 = iVar3 + 0xc27;
    }
    DenseGraph::DenseGraph(&g_1,&g);
    iVar3 = 0;
    iVar4 = 0;
    do {
      if (iVar4 == 100) {
        DenseGraph::Transpose(&g2_1,&g);
        iVar3 = 0;
        iVar4 = 0;
        do {
          if (iVar4 == 100) {
            for (iVar3 = 0; iVar3 != 0x14; iVar3 = iVar3 + 1) {
              for (iVar4 = 0; iVar4 != 0x14; iVar4 = iVar4 + 1) {
                bVar2 = DenseGraph::DoesEdgeExist(&g_1,iVar3,iVar4);
                if (bVar2) {
                  bVar2 = DenseGraph::DoesEdgeExist(&g2_1,iVar4,iVar3);
                  if (!bVar2) goto LAB_00101edc;
                }
                else {
                  bVar2 = DenseGraph::DoesEdgeExist(&g2_1,iVar4,iVar3);
                  if (bVar2) goto LAB_00101edc;
                }
              }
            }
LAB_00102081:
            std::
            _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
            ::~_Rb_tree(&g2_1.s._M_t);
LAB_0010208b:
            std::
            _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
            ::~_Rb_tree(&g_1.s._M_t);
            std::
            _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
            ::~_Rb_tree(&g.s._M_t);
            return true;
          }
          bVar2 = DenseGraph::DoesEdgeExist
                            (&g2_1,(iVar3 * iVar4 + 0x3baa5aU ^ iVar4 + 0x20423U) % 0x14,
                             (iVar4 + 0x7d83U ^ 0x1312a) % 0x14);
          iVar3 = iVar3 + 0xc27;
          iVar4 = iVar4 + 1;
        } while (bVar2);
        goto LAB_00101edc;
      }
      bVar2 = DenseGraph::DoesEdgeExist
                        (&g_1,(iVar4 + 0x7d83U ^ 0x1312a) % 0x14,
                         (iVar3 * iVar4 + 0x3baa5aU ^ iVar4 + 0x20423U) % 0x14);
      iVar3 = iVar3 + 0xc27;
      iVar4 = iVar4 + 1;
    } while (bVar2);
    break;
  case 7:
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    g.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    g.n = 0x79;
    g.t = false;
    iVar3 = 0;
    iVar4 = 0;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    for (; iVar4 != 1000; iVar4 = iVar4 + 1) {
      DenseGraph::AddEdge(&g,(iVar4 + 0x7d83U ^ 0x1312a) % 0x79,
                          (iVar3 * iVar4 + 0x3baa5aU ^ iVar4 + 0x20423U) % 0x79);
      iVar3 = iVar3 + 0xc27;
    }
    DenseGraph::DenseGraph(&g_1,&g);
    iVar3 = 0;
    iVar4 = 0;
    do {
      if (iVar4 == 1000) {
        DenseGraph::Transpose(&g2_1,&g);
        iVar3 = 0;
        iVar4 = 0;
        goto LAB_00101e0d;
      }
      bVar2 = DenseGraph::DoesEdgeExist
                        (&g_1,(iVar4 + 0x7d83U ^ 0x1312a) % 0x79,
                         (iVar3 * iVar4 + 0x3baa5aU ^ iVar4 + 0x20423U) % 0x79);
      iVar3 = iVar3 + 0xc27;
      iVar4 = iVar4 + 1;
    } while (bVar2);
    break;
  case 8:
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    g.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    g.n = 1000;
    g.t = false;
    iVar3 = 0;
    iVar4 = 0;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    for (; iVar4 != 100000; iVar4 = iVar4 + 1) {
      DenseGraph::AddEdge(&g,(iVar4 + 0x7d83U ^ 0x1312a) % 1000,
                          (iVar3 * iVar4 + 0x3baa5aU ^ iVar4 + 0x20423U) % 1000);
      iVar3 = iVar3 + 0xc27;
    }
    DenseGraph::DenseGraph(&g_1,&g);
    iVar3 = 0;
    iVar4 = 0;
    do {
      if (iVar4 == 100000) {
        DenseGraph::Transpose(&g2_1,&g);
        iVar3 = 0;
        iVar4 = 0;
        goto LAB_00101d24;
      }
      bVar2 = DenseGraph::DoesEdgeExist
                        (&g_1,(iVar4 + 0x7d83U ^ 0x1312a) % 1000,
                         (iVar3 * iVar4 + 0x3baa5aU ^ iVar4 + 0x20423U) % 1000);
      iVar3 = iVar3 + 0xc27;
      iVar4 = iVar4 + 1;
    } while (bVar2);
    break;
  case 9:
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    g.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    g.n = 1000;
    g.t = false;
    iVar4 = 0;
    iVar3 = 0;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    for (; iVar3 != 100; iVar3 = iVar3 + 1) {
      a = (iVar3 + 0x7d83U ^ 0x1312a) % 1000;
      b = (iVar4 * iVar3 + 0x3baa5aU ^ iVar3 + 0x20423U) % 1000;
      DenseGraph::AddEdge(&g,a,b);
      DenseGraph::RemoveEdge(&g,a,b);
      iVar4 = iVar4 + 0xc27;
    }
    DenseGraph::DenseGraph(&g_1,&g);
    iVar3 = 0;
    iVar4 = 0;
    do {
      if (iVar4 == 100) goto LAB_0010208b;
      bVar2 = DenseGraph::DoesEdgeExist
                        (&g_1,(iVar4 + 0x7d83U ^ 0x1312a) % 1000,
                         (iVar3 * iVar4 + 0x3baa5aU ^ iVar4 + 0x20423U) % 1000);
      iVar3 = iVar3 + 0xc27;
      iVar4 = iVar4 + 1;
    } while (!bVar2);
    break;
  case 10:
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    g.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    g.n = 999;
    g.t = false;
    iVar3 = 0;
    iVar4 = 0;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    g.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    for (; iVar4 != 200000; iVar4 = iVar4 + 1) {
      DenseGraph::AddEdge(&g,(iVar4 + 0x7d83U ^ 0x1312a) % 999,
                          (iVar3 * iVar4 + 0x3baa5aU ^ iVar4 + 0x20423U) % 999);
      iVar3 = iVar3 + 0xc27;
    }
    DenseGraph::Transpose(&g_1,&g);
    DenseGraph::Transpose(&g2_1,&g_1);
    DenseGraph::operator=(&g,&g2_1);
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::~_Rb_tree(&g2_1.s._M_t);
    iVar3 = 0;
    iVar4 = 0;
    do {
      if (iVar4 == 200000) {
        DenseGraph::Transpose(&g2_1,&g);
        iVar3 = 0;
        iVar4 = 0;
        goto LAB_00101e85;
      }
      bVar2 = DenseGraph::DoesEdgeExist
                        (&g,(iVar4 + 0x7d83U ^ 0x1312a) % 999,
                         (iVar3 * iVar4 + 0x3baa5aU ^ iVar4 + 0x20423U) % 999);
      iVar3 = iVar3 + 0xc27;
      iVar4 = iVar4 + 1;
    } while (bVar2);
  }
  goto LAB_00101ee6;
LAB_00101e85:
  if (iVar4 != 200000) goto code_r0x00101e92;
  for (iVar3 = 0; iVar3 != 999; iVar3 = iVar3 + 1) {
    for (iVar4 = 0; iVar4 != 999; iVar4 = iVar4 + 1) {
      bVar2 = DenseGraph::DoesEdgeExist(&g,iVar3,iVar4);
      if (bVar2) {
        bVar2 = DenseGraph::DoesEdgeExist(&g2_1,iVar4,iVar3);
        if (!bVar2) goto LAB_00101edc;
      }
      else {
        bVar2 = DenseGraph::DoesEdgeExist(&g2_1,iVar4,iVar3);
        if (bVar2) goto LAB_00101edc;
      }
    }
  }
  goto LAB_00102081;
code_r0x00101e92:
  bVar2 = DenseGraph::DoesEdgeExist
                    (&g2_1,(iVar3 * iVar4 + 0x3baa5aU ^ iVar4 + 0x20423U) % 999,
                     (iVar4 + 0x7d83U ^ 0x1312a) % 999);
  iVar3 = iVar3 + 0xc27;
  iVar4 = iVar4 + 1;
  if (!bVar2) goto LAB_00101edc;
  goto LAB_00101e85;
  while( true ) {
    bVar2 = DenseGraph::DoesEdgeExist
                      (&g2_1,(iVar3 * iVar4 + 0x3baa5aU ^ iVar4 + 0x20423U) % 1000,
                       (iVar4 + 0x7d83U ^ 0x1312a) % 1000);
    iVar3 = iVar3 + 0xc27;
    iVar4 = iVar4 + 1;
    if (!bVar2) break;
LAB_00101d24:
    if (iVar4 == 100000) {
      for (iVar3 = 0; iVar3 != 1000; iVar3 = iVar3 + 1) {
        for (iVar4 = 0; iVar4 != 1000; iVar4 = iVar4 + 1) {
          bVar2 = DenseGraph::DoesEdgeExist(&g_1,iVar3,iVar4);
          if (bVar2) {
            bVar2 = DenseGraph::DoesEdgeExist(&g2_1,iVar4,iVar3);
            if (!bVar2) goto LAB_00101edc;
          }
          else {
            bVar2 = DenseGraph::DoesEdgeExist(&g2_1,iVar4,iVar3);
            if (bVar2) goto LAB_00101edc;
          }
        }
      }
      goto LAB_00102081;
    }
  }
  goto LAB_00101edc;
  while( true ) {
    bVar2 = DenseGraph::DoesEdgeExist
                      (&g2_1,(iVar3 * iVar4 + 0x3baa5aU ^ iVar4 + 0x20423U) % 0x79,
                       (iVar4 + 0x7d83U ^ 0x1312a) % 0x79);
    iVar3 = iVar3 + 0xc27;
    iVar4 = iVar4 + 1;
    if (!bVar2) break;
LAB_00101e0d:
    if (iVar4 == 1000) {
      for (iVar3 = 0; iVar3 != 0x79; iVar3 = iVar3 + 1) {
        for (iVar4 = 0; iVar4 != 0x79; iVar4 = iVar4 + 1) {
          bVar2 = DenseGraph::DoesEdgeExist(&g_1,iVar3,iVar4);
          if (bVar2) {
            bVar2 = DenseGraph::DoesEdgeExist(&g2_1,iVar4,iVar3);
            if (!bVar2) goto LAB_00101edc;
          }
          else {
            bVar2 = DenseGraph::DoesEdgeExist(&g2_1,iVar4,iVar3);
            if (bVar2) goto LAB_00101edc;
          }
        }
      }
      goto LAB_00102081;
    }
  }
LAB_00101edc:
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&g2_1.s._M_t);
LAB_00101ee6:
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&g_1.s._M_t);
LAB_00101ef0:
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&g.s._M_t);
  return false;
}

Assistant:

bool runCase(int testCase) {
    if (testCase == 1) {
        DenseGraph g;
        g.AddEdge(0,1);
        if (!g.DoesEdgeExist(0,1)) return false;
        if (g.DoesEdgeExist(1,0)) return false;
    } else
    if (testCase == 2) {
        DenseGraph g(4);
        g.AddEdge(0,1);
        g.AddEdge(0,2);
        g.AddEdge(1,2);
        g.AddEdge(1,3);
        if (!g.DoesEdgeExist(0,1)) return false;
        if (!g.DoesEdgeExist(0,2)) return false;
        if (!g.DoesEdgeExist(1,2)) return false;
        if (!g.DoesEdgeExist(1,3)) return false;
        if (g.DoesEdgeExist(0,3)) return false;
        if (g.DoesEdgeExist(1,0)) return false;
    } else
    if (testCase == 3) {
        DenseGraph g2(4);
        DenseGraph g(g2);
        g.AddEdge(0,1);
        g.AddEdge(0,2);
        g.AddEdge(1,2);
        g.AddEdge(1,3);
        if (!g.DoesEdgeExist(0,1)) return false;
        if (!g.DoesEdgeExist(0,2)) return false;
        if (!g.DoesEdgeExist(1,2)) return false;
        if (!g.DoesEdgeExist(1,3)) return false;
        if (g.DoesEdgeExist(0,3)) return false;
        if (g.DoesEdgeExist(1,0)) return false;
    } else
    if (testCase == 4) {
        DenseGraph g2(4);
        DenseGraph g = g2;
        g.AddEdge(0,1);
        g.AddEdge(0,2);
        g.AddEdge(1,2);
        g.AddEdge(1,3);
        g.AddEdge(2,3);
        g.AddEdge(1,0);
        g.RemoveEdge(1,0);
        g.AddEdge(0,3);
        g.RemoveEdge(0,3);
        g.AddEdge(3,2);
        g.RemoveEdge(3,2);
        g.AddEdge(3,3);

        if (!g.DoesEdgeExist(0,1)) return false;
        if (!g.DoesEdgeExist(0,2)) return false;
        if (!g.DoesEdgeExist(1,2)) return false;
        if (!g.DoesEdgeExist(1,3)) return false;
        if (!g.DoesEdgeExist(2,3)) return false;
        if (!g.DoesEdgeExist(3,3)) return false;
        if (g.DoesEdgeExist(0,3)) return false;
        if (g.DoesEdgeExist(1,0)) return false;
        if (g.DoesEdgeExist(3,2)) return false;


    } else
    if (testCase == 5) {
        DenseGraph g2(5);
        DenseGraph g(2);
        g = g2;
        g.RemoveEdge(1,2);
        g.RemoveEdge(0,1);
        g.AddEdge(0,1);
        g.AddEdge(0,2);
        g.AddEdge(1,2);
        g.RemoveEdge(1,3);
        g.AddEdge(1,3);
        g.RemoveEdge(4,2);
        g.AddEdge(4,2);
        g.RemoveEdge(1,0);
        g.AddEdge(0,3);
        g.RemoveEdge(0,3);
        g.AddEdge(3,2);
        g.RemoveEdge(3,2);

        if (!g.DoesEdgeExist(0,1)) return false;
        if (!g.DoesEdgeExist(0,2)) return false;
        if (!g.DoesEdgeExist(1,2)) return false;
        if (!g.DoesEdgeExist(1,3)) return false;
        if (!g.DoesEdgeExist(4,2)) return false;
        if (g.DoesEdgeExist(0,3)) return false;
        if (g.DoesEdgeExist(1,0)) return false;
        if (g.DoesEdgeExist(2,4)) return false;
    } else
    if (testCase == 6) {
        int n = 20;
        int k = 100;
        DenseGraph gt(n);
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            gt.AddEdge(a,b);
        }
        DenseGraph g = gt;
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g.DoesEdgeExist(a,b)) return false;
        }
        DenseGraph g2 = gt.Transpose();
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g2.DoesEdgeExist(b,a)) return false;
        }
        for (int i = 0; i < n; i++) {
            for (int j = 0; j < n; j++) {
                if (g.DoesEdgeExist(i,j)) {
                    if (!g2.DoesEdgeExist(j,i)) return false;
                } else {
                    if (g2.DoesEdgeExist(j,i)) return false;
                }
            }
        }


    } else
    if (testCase == 7) {
        int n = 121;
        int k = 1000;
        DenseGraph gt(n);
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            gt.AddEdge(a,b);
        }
        DenseGraph g = gt;
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g.DoesEdgeExist(a,b)) return false;
        }
        DenseGraph g2 = gt.Transpose();
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g2.DoesEdgeExist(b,a)) return false;
        }
        for (int i = 0; i < n; i++) {
            for (int j = 0; j < n; j++) {
                if (g.DoesEdgeExist(i,j)) {
                    if (!g2.DoesEdgeExist(j,i)) return false;
                } else {
                    if (g2.DoesEdgeExist(j,i)) return false;
                }
            }
        }
    } else
    if (testCase == 8) {
        int n = 1000;
        int k = 100000;
        DenseGraph gt(n);
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            gt.AddEdge(a,b);
        }
        DenseGraph g = gt;
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g.DoesEdgeExist(a,b)) return false;
        }
        DenseGraph g2 = gt.Transpose();
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g2.DoesEdgeExist(b,a)) return false;
        }
        for (int i = 0; i < n; i++) {
            for (int j = 0; j < n; j++) {
                if (g.DoesEdgeExist(i,j)) {
                    if (!g2.DoesEdgeExist(j,i)) return false;
                } else {
                    if (g2.DoesEdgeExist(j,i)) return false;
                }
            }
        }
    } else
    if (testCase == 9) {
        int n = 1000;
        int k = 100;
        DenseGraph gt(n);
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            gt.AddEdge(a,b);
            gt.RemoveEdge(a,b);
        }
        DenseGraph g = gt;
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (g.DoesEdgeExist(a,b)) return false;
        }
    } else
    if (testCase == 10) {
        int n = 999;
        int k = 200000;
        DenseGraph gt(n);
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            gt.AddEdge(a,b);
        }
        DenseGraph g = gt.Transpose();
        gt = g.Transpose();
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!gt.DoesEdgeExist(a,b)) return false;
        }
        DenseGraph g2 = gt.Transpose();
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g2.DoesEdgeExist(b,a)) return false;
        }
        for (int i = 0; i < n; i++) {
            for (int j = 0; j < n; j++) {
                if (gt.DoesEdgeExist(i,j)) {
                    if (!g2.DoesEdgeExist(j,i)) return false;
                } else {
                    if (g2.DoesEdgeExist(j,i)) return false;
                }
            }
        }
    }
    return true;
}